

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Stoppable stoppable;
  AReceiver a;
  DemoController demo;
  int detach;
  DemoController *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe4c;
  BaseThread *in_stack_fffffffffffffe50;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffe60;
  int local_194;
  duration<long,std::ratio<1l,1000l>> local_190 [200];
  undefined1 local_c8 [196];
  int local_4;
  
  local_4 = 0;
  detach = (int)((ulong)local_c8 >> 0x20);
  DemoController::DemoController(in_stack_fffffffffffffe30);
  BaseThread::Start(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  AReceiver::AReceiver((AReceiver *)in_stack_fffffffffffffe30);
  BaseThread::Start(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_194 = 0x32;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_190,&local_194);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffffe60);
  Stoppable::Stoppable((Stoppable *)in_stack_fffffffffffffe30);
  BaseThread::operator()((BaseThread *)in_stack_fffffffffffffe30,detach);
  BaseStoppable::Stop((BaseStoppable *)0x103682);
  BaseThread::Wait((BaseThread *)in_stack_fffffffffffffe30);
  BaseThread::Wait((BaseThread *)in_stack_fffffffffffffe30);
  BaseStoppable::Stop((BaseStoppable *)0x1036a9);
  BaseThread::Wait((BaseThread *)in_stack_fffffffffffffe30);
  local_4 = 0;
  Stoppable::~Stoppable((Stoppable *)0x1036cc);
  AReceiver::~AReceiver((AReceiver *)0x1036d6);
  DemoController::~DemoController((DemoController *)0x1036e3);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    (void)argc, (void)argv;

    DemoController demo;
    demo.Start();

    AReceiver a;
    a.Start();

    std::this_thread::sleep_for(std::chrono::milliseconds(50));

    Stoppable stoppable;
    stoppable();
    stoppable.Stop();

    stoppable.Wait();
    demo.Wait();

    a.Stop();
    a.Wait();
    return 0;
}